

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleLineDirective(cmFortranParser *parser,char *filename)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  allocator local_39;
  undefined1 local_38 [8];
  string included;
  char *filename_local;
  cmFortranParser *parser_local;
  
  included.field_2._8_8_ = filename;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,filename,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar3 != '<')) {
    cmsys::SystemTools::ReplaceString((string *)local_38,"\\\\","\\");
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_38);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_38,true);
    if (bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&parser->Info->Includes,(value_type *)local_38);
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmFortranParser_RuleLineDirective(cmFortranParser* parser,
                                       const char* filename)
{
  // This is a #line directive naming a file encountered during preprocessing.
  std::string included = filename;

  // Skip #line directives referencing non-files like
  // "<built-in>" or "<command-line>".
  if (included.empty() || included[0] == '<') {
    return;
  }

  // Fix windows file path separators since our lexer does not
  // process escape sequences in string literals.
  cmSystemTools::ReplaceString(included, "\\\\", "\\");
  cmSystemTools::ConvertToUnixSlashes(included);

  // Save the named file as included in the source.
  if (cmSystemTools::FileExists(included, true)) {
    parser->Info.Includes.insert(included);
  }
}